

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void removelastlineinfo(FuncState *fs)

{
  int iVar1;
  
  iVar1 = (int)fs->f->lineinfo[(long)fs->pc + -1];
  if (iVar1 == -0x80) {
    fs->nabslineinfo = fs->nabslineinfo + -1;
    fs->iwthabs = 0x81;
    return;
  }
  fs->previousline = fs->previousline - iVar1;
  fs->iwthabs = fs->iwthabs + 0xff;
  return;
}

Assistant:

static void removelastlineinfo (FuncState *fs) {
  Proto *f = fs->f;
  int pc = fs->pc - 1;  /* last instruction coded */
  if (f->lineinfo[pc] != ABSLINEINFO) {  /* relative line info? */
    fs->previousline -= f->lineinfo[pc];  /* correct last line saved */
    fs->iwthabs--;  /* undo previous increment */
  }
  else {  /* absolute line information */
    lua_assert(f->abslineinfo[fs->nabslineinfo - 1].pc == pc);
    fs->nabslineinfo--;  /* remove it */
    fs->iwthabs = MAXIWTHABS + 1;  /* force next line info to be absolute */
  }
}